

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
find<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,
          Reader *params)

{
  int iVar1;
  RawBrandedSchema *pRVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *pEVar7;
  StringPtr *in_R8;
  ulong uVar8;
  Maybe<unsigned_long> MVar9;
  
  pEVar7 = table.ptr;
  if (*(long *)&(pEVar7->value).index == 0) {
    *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
    aVar6.value = table.size_;
  }
  else {
    uVar4 = hashCode<capnp::Text::Reader&>((Reader *)in_R8);
    uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),(pEVar7->value).index);
    aVar6 = extraout_RDX;
    while( true ) {
      uVar8 = (ulong)uVar5;
      pRVar2 = (pEVar7->value).parent.super_Schema.raw;
      iVar1 = *(int *)((long)&pRVar2->generic + uVar8 * 8 + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(&pRVar2->generic + uVar8) == (uint)(uVar4 != 0))) &&
         (bVar3 = StringPtr::operator==
                            ((StringPtr *)((ulong)(iVar1 - 2) * 0x50 + table.size_),in_R8),
         aVar6 = extraout_RDX_00, bVar3)) {
        iVar1 = *(int *)((long)&pRVar2->generic + uVar8 * 8 + 4);
        *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_003e1b65;
      }
      uVar5 = 0;
      if (uVar8 + 1 != *(long *)&(pEVar7->value).index) {
        uVar5 = (uint)(uVar8 + 1);
      }
    }
    *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
  }
LAB_003e1b65:
  MVar9.ptr.field_1.value = aVar6.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }